

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pm_matrix_tests.h
# Opt level: O2

void test_chain_row_removal<Gudhi::persistence_matrix::Matrix<Chain_rep_options_with_row_access<false,(Gudhi::persistence_matrix::Column_types)7,true,true,false,false,false,false>>>
               (Matrix<Chain_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false,_false,_false,_false>_>
                *m)

{
  Matrix_row_access_option *this;
  shared_count sStack_138;
  undefined **local_130;
  undefined1 local_128;
  undefined8 *local_120;
  char *local_118;
  char *local_e0;
  char *local_d8;
  undefined1 *local_d0;
  undefined1 *local_c8;
  char *local_c0;
  char *local_b8;
  undefined1 *local_b0;
  undefined1 *local_a8;
  char *local_a0;
  char *local_98;
  char *local_60;
  char *local_58;
  undefined1 *local_50;
  undefined1 *local_48;
  char *local_40;
  char *local_38;
  
  this = &(m->matrix_).super_Matrix_row_access_option;
  Gudhi::persistence_matrix::
  Matrix_row_access<std::set<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Chain_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false,_false,_false,_false>_>_>,_Gudhi::persistence_matrix::Matrix<Chain_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false,_false,_false,_false>_>::RowEntryComp,_std::allocator<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Chain_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false,_false,_false,_false>_>_>_>_>,_std::map<unsigned_int,_std::set<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Chain_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false,_false,_false,_false>_>_>,_Gudhi::persistence_matrix::Matrix<Chain_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false,_false,_false,_false>_>::RowEntryComp,_std::allocator<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Chain_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false,_false,_false,_false>_>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::set<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Chain_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false,_false,_false,_false>_>_>,_Gudhi::persistence_matrix::Matrix<Chain_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false,_false,_false,_false>_>::RowEntryComp,_std::allocator<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Chain_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false,_false,_false,_false>_>_>_>_>_>_>_>,_true,_unsigned_int>
  ::erase_empty_row(this,6);
  Gudhi::persistence_matrix::
  Matrix_row_access<std::set<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Chain_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false,_false,_false,_false>_>_>,_Gudhi::persistence_matrix::Matrix<Chain_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false,_false,_false,_false>_>::RowEntryComp,_std::allocator<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Chain_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false,_false,_false,_false>_>_>_>_>,_std::map<unsigned_int,_std::set<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Chain_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false,_false,_false,_false>_>_>,_Gudhi::persistence_matrix::Matrix<Chain_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false,_false,_false,_false>_>::RowEntryComp,_std::allocator<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Chain_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false,_false,_false,_false>_>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::set<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Chain_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false,_false,_false,_false>_>_>,_Gudhi::persistence_matrix::Matrix<Chain_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false,_false,_false,_false>_>::RowEntryComp,_std::allocator<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Chain_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false,_false,_false,_false>_>_>_>_>_>_>_>,_true,_unsigned_int>
  ::get_row(this,6);
  local_40 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_38 = "";
  local_50 = &boost::unit_test::basic_cstring<char_const>::null;
  local_48 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_40,0x330);
  sStack_138.pi_ = (sp_counted_base *)0x0;
  local_128 = 0;
  local_130 = &PTR__lazy_ostream_00205730;
  local_120 = &boost::unit_test::lazy_ostream::inst;
  local_118 = "no exceptions thrown by m.get_row(6)";
  local_60 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_58 = "";
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_138);
  Gudhi::persistence_matrix::
  Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false,_false,_false,_false>_>_>
  ::remove_last(&m->matrix_);
  local_a0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_98 = "";
  local_b0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_a8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_a0,0x334);
  Gudhi::persistence_matrix::
  Matrix_row_access<std::set<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Chain_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false,_false,_false,_false>_>_>,_Gudhi::persistence_matrix::Matrix<Chain_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false,_false,_false,_false>_>::RowEntryComp,_std::allocator<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Chain_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false,_false,_false,_false>_>_>_>_>,_std::map<unsigned_int,_std::set<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Chain_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false,_false,_false,_false>_>_>,_Gudhi::persistence_matrix::Matrix<Chain_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false,_false,_false,_false>_>::RowEntryComp,_std::allocator<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Chain_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false,_false,_false,_false>_>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::set<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Chain_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false,_false,_false,_false>_>_>,_Gudhi::persistence_matrix::Matrix<Chain_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false,_false,_false,_false>_>::RowEntryComp,_std::allocator<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Chain_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false,_false,_false,_false>_>_>_>_>_>_>_>,_true,_unsigned_int>
  ::get_row(this,6);
  local_c0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_b8 = "";
  local_d0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_c8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_c0,0x334);
  sStack_138.pi_ = (sp_counted_base *)0x0;
  local_128 = 0;
  local_130 = &PTR__lazy_ostream_002057b0;
  local_120 = &boost::unit_test::lazy_ostream::inst;
  local_118 = "exception std::logic_error expected but not raised";
  local_e0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_d8 = "";
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_138);
  return;
}

Assistant:

void test_chain_row_removal(Matrix& m) {
  m.erase_empty_row(6);  // not empty, so ignored
  BOOST_CHECK_NO_THROW(m.get_row(6));

  if constexpr (Matrix::Option_list::has_map_column_container || !Matrix::Option_list::has_vine_update) {
    m.remove_last();  // calls erase_empty_row(6)
    BOOST_CHECK_THROW(m.get_row(6), std::logic_error);
  }
}